

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void memory_region_del_subregion_mips64(MemoryRegion *mr,MemoryRegion *subregion)

{
  MemoryRegion *subregion_local;
  MemoryRegion *mr_local;
  
  memory_region_transaction_begin_mips64();
  if (subregion->container == mr) {
    subregion->container = (MemoryRegion *)0x0;
    if ((subregion->subregions_link).tqe_next == (MemoryRegion *)0x0) {
      (mr->subregions).tqh_circ.tql_prev = (subregion->subregions_link).tqe_circ.tql_prev;
    }
    else {
      (((subregion->subregions_link).tqe_next)->subregions_link).tqe_circ.tql_prev =
           (subregion->subregions_link).tqe_circ.tql_prev;
    }
    ((subregion->subregions_link).tqe_circ.tql_prev)->tql_next =
         (subregion->subregions_link).tqe_next;
    (subregion->subregions_link).tqe_circ.tql_prev = (QTailQLink *)0x0;
    (subregion->subregions_link).tqe_next = (MemoryRegion *)0x0;
    (subregion->subregions_link).tqe_next = (MemoryRegion *)0x0;
    mr->uc->memory_region_update_pending = true;
    memory_region_transaction_commit_mips64(mr);
    return;
  }
  __assert_fail("subregion->container == mr",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/softmmu/memory.c"
                ,0x4f9,"void memory_region_del_subregion_mips64(MemoryRegion *, MemoryRegion *)");
}

Assistant:

void memory_region_del_subregion(MemoryRegion *mr,
                                 MemoryRegion *subregion)
{
    memory_region_transaction_begin();
    assert(subregion->container == mr);
    subregion->container = NULL;
    QTAILQ_REMOVE(&mr->subregions, subregion, subregions_link);
    mr->uc->memory_region_update_pending = true;
    memory_region_transaction_commit(mr);
}